

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_gen_privkey
              (mbedtls_ecp_group *grp,mbedtls_mpi *d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong pos;
  int iVar1;
  size_t sVar2;
  size_t count;
  int iVar3;
  ulong size;
  uint cmp;
  ulong local_48;
  mbedtls_mpi *local_40;
  mbedtls_ecp_group *local_38;
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  local_48 = grp->nbits + 7;
  size = local_48 >> 3;
  iVar3 = -0x4f80;
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    do {
      iVar3 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
      if (iVar3 != 0) {
        return iVar3;
      }
      sVar2 = mbedtls_mpi_bitlen(d);
    } while (sVar2 == 0);
    sVar2 = mbedtls_mpi_bitlen(d);
    pos = grp->nbits;
    count = (sVar2 - 1) - pos;
    if (sVar2 - 1 < pos || count == 0) {
      iVar3 = mbedtls_mpi_set_bit(d,pos,'\x01');
    }
    else {
      iVar3 = mbedtls_mpi_shift_r(d,count);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = mbedtls_mpi_set_bit(d,0,'\0');
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = 0;
    iVar1 = mbedtls_mpi_set_bit(d,1,'\0');
    if (iVar1 != 0) {
      return iVar1;
    }
    if (grp->nbits == 0xfe) {
      iVar3 = 0;
      iVar1 = mbedtls_mpi_set_bit(d,2,'\0');
      if (iVar1 != 0) {
        return iVar1;
      }
    }
  }
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
    cmp = 0;
    local_48 = local_48 & 0xfffffffffffffff8;
    local_40 = &grp->N;
    iVar3 = 0x1f;
    local_38 = grp;
    do {
      iVar1 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_mpi_shift_r(d,local_48 - local_38->nbits);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        return -0x4d00;
      }
      iVar1 = mbedtls_mpi_lt_mpi_ct(d,local_40,&cmp);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_mpi_cmp_int(d,1);
    } while ((iVar1 < 0) || (cmp != 1));
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_ecp_gen_privkey( const mbedtls_ecp_group *grp,
                     mbedtls_mpi *d,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    size_t n_size;

    ECP_VALIDATE_RET( grp   != NULL );
    ECP_VALIDATE_RET( d     != NULL );
    ECP_VALIDATE_RET( f_rng != NULL );

    n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
        } while( mbedtls_mpi_bitlen( d ) == 0);

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last two bits are unset for Curve448, three bits for
           Curve25519 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        if( grp->nbits == 254 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
        }
    }
#endif /* ECP_MONTGOMERY */

#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;
        unsigned cmp = 0;

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );

            ret = mbedtls_mpi_lt_mpi_ct( d, &grp->N, &cmp );
            if( ret != 0 )
            {
                goto cleanup;
            }
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 || cmp != 1 );
    }
#endif /* ECP_SHORTWEIERSTRASS */

cleanup:
    return( ret );
}